

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O2

void __thiscall
tcu::x11::egl::Display::Display
          (Display *this,
          MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> *x11Display)

{
  XlibDisplay *pXVar1;
  
  eglu::NativeDisplay::NativeDisplay
            (&this->super_NativeDisplay,
             CAPABILITY_GET_DISPLAY_PLATFORM|CAPABILITY_GET_DISPLAY_LEGACY,0x31d5,
             "EGL_EXT_platform_x11");
  (this->super_NativeDisplay)._vptr_NativeDisplay = (_func_int **)&PTR__Display_00c078b0;
  pXVar1 = (x11Display->
           super_UniqueBase<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>).
           m_data.ptr;
  (x11Display->super_UniqueBase<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>).
  m_data.ptr = (XlibDisplay *)0x0;
  (this->m_display).
  super_UniqueBase<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>.m_data.ptr =
       pXVar1;
  Library::Library(&this->m_library);
  return;
}

Assistant:

Display				(MovePtr<XlibDisplay> x11Display)
									: NativeDisplay	(CAPABILITIES,
													 EGL_PLATFORM_X11_EXT,
													 "EGL_EXT_platform_x11")
									, m_display		(x11Display) {}